

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

bool __thiscall
bssl::Vector<bssl::CertCompressionAlg>::MaybeGrow(Vector<bssl::CertCompressionAlg> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  CertCompressionAlg *pCVar4;
  undefined8 uVar5;
  CertCompressionAlg *pCVar6;
  long lVar7;
  int line;
  ulong uVar8;
  
  uVar8 = this->capacity_;
  if (this->size_ < uVar8) {
    return true;
  }
  if (uVar8 == 0) {
    uVar8 = 0x10;
  }
  else {
    if ((long)uVar8 < 0) {
      line = 0x14d;
      goto LAB_0015d6c7;
    }
    uVar8 = uVar8 * 2;
  }
  if (uVar8 < 0xaaaaaaaaaaaaaab) {
    pCVar6 = (CertCompressionAlg *)OPENSSL_malloc(uVar8 * 0x18);
    if (pCVar6 == (CertCompressionAlg *)0x0) {
      return pCVar6 != (CertCompressionAlg *)0x0;
    }
    sVar3 = this->size_;
    if (sVar3 != 0) {
      pCVar4 = this->data_;
      lVar7 = 0;
      do {
        *(undefined8 *)((long)&pCVar6->alg_id + lVar7) =
             *(undefined8 *)((long)&pCVar4->alg_id + lVar7);
        puVar1 = (undefined8 *)((long)&pCVar4->compress + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pCVar6->compress + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar7 = lVar7 + 0x18;
      } while (sVar3 * 0x18 != lVar7);
    }
    OPENSSL_free(this->data_);
    this->data_ = (CertCompressionAlg *)0x0;
    this->size_ = 0;
    this->data_ = pCVar6;
    this->size_ = sVar3;
    this->capacity_ = uVar8;
    return true;
  }
  line = 0x153;
LAB_0015d6c7:
  ERR_put_error(0xe,0,0x45,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                ,line);
  return false;
}

Assistant:

bool MaybeGrow() {
    // No need to grow if we have room for one more T.
    if (size_ < capacity_) {
      return true;
    }
    size_t new_capacity = kDefaultSize;
    if (capacity_ > 0) {
      // Double the array's size if it's safe to do so.
      if (capacity_ > SIZE_MAX / 2) {
        OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
        return false;
      }
      new_capacity = capacity_ * 2;
    }
    if (new_capacity > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    T *new_data =
        reinterpret_cast<T *>(OPENSSL_malloc(new_capacity * sizeof(T)));
    if (new_data == nullptr) {
      return false;
    }
    size_t new_size = size_;
    std::uninitialized_move(begin(), end(), new_data);
    clear();
    data_ = new_data;
    size_ = new_size;
    capacity_ = new_capacity;
    return true;
  }